

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68020_bsr_32(m68k_info *info)

{
  long in_RDI;
  m68k_info *unaff_retaddr;
  long lVar1;
  
  if ((*(uint *)(in_RDI + 0x28) & 0x1c) == 0) {
    d68000_invalid((m68k_info *)0x39e443);
  }
  else {
    lVar1 = in_RDI;
    peek_imm_32((m68k_info *)0x39e45b);
    build_relative_branch
              (unaff_retaddr,(int)((ulong)lVar1 >> 0x20),(int)lVar1,(int)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

static void d68020_bsr_32(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68020_PLUS);
	build_relative_branch(info, M68K_INS_BSR, 4, peek_imm_32(info));
}